

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

double __thiscall HModel::computePrObj(HModel *this)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar1 = this->numCol;
  pdVar3 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar4 = uVar5;
  }
  dVar6 = 0.0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    if (iVar2 < (int)uVar1) {
      dVar6 = dVar6 + (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5] * pdVar3[iVar2];
    }
  }
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] != 0) {
      dVar6 = dVar6 + (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5] * pdVar3[uVar5];
    }
  }
  return dVar6;
}

Assistant:

double HModel::computePrObj() {
    double prObj = 0;
    for (int row = 0; row < numRow; row++) {
      int var = basicIndex[row];
      if (var < numCol) prObj += baseValue[row]*colCost[var];
    }
    for (int col = 0; col < numCol; col++)
        if (nonbasicFlag[col]) prObj += workValue[col]*colCost[col];
    return prObj;
}